

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearObjectAppearance.cpp
# Opt level: O2

KString * __thiscall
KDIS::DATA_TYPE::LinearObjectAppearance::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,LinearObjectAppearance *this)

{
  ostream *poVar1;
  KStringStream ss;
  KString KStack_1b8;
  stringstream local_198 [16];
  ostream local_188 [376];
  
  std::__cxx11::stringstream::stringstream(local_198);
  ObjectAppearance::GetAsString_abi_cxx11_(&KStack_1b8,&this->super_ObjectAppearance);
  poVar1 = std::operator<<(local_188,(string *)&KStack_1b8);
  poVar1 = std::operator<<(poVar1,"\tSpecific Appearance: ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)&KStack_1b8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_198);
  return __return_storage_ptr__;
}

Assistant:

KString LinearObjectAppearance::GetAsString() const
{
    KStringStream ss;

    ss << ObjectAppearance::GetAsString()
       << "\tSpecific Appearance: " << m_SpecificAppearanceUnion.m_ui32SpecificAppearance << "\n";

    return ss.str();
}